

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWOB
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  DeadlyImportError *pDVar4;
  allocator<char> local_91;
  undefined1 local_90 [4];
  int16_t surface;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  ushort local_36;
  uint local_34;
  uint16_t numIndices;
  uint16_t *puStack_30;
  uint max_local;
  uint16_t *end_local;
  uint16_t **cursor_local;
  uint *faces_local;
  uint *verts_local;
  LWOImporter *this_local;
  
  local_34 = max;
  puStack_30 = end;
  end_local = (uint16_t *)cursor;
  cursor_local = (uint16_t **)faces;
  faces_local = verts;
  verts_local = (uint *)this;
  while( true ) {
    uVar3 = local_34;
    if (*(uint16_t **)end_local < puStack_30) {
      local_34 = local_34 - 1;
    }
    if (*(uint16_t **)end_local >= puStack_30 || uVar3 == 0) {
      return;
    }
    if ((long)puStack_30 - *(long *)end_local >> 1 < 2) {
      local_6d = 1;
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"LWOB: Unexpected end of file",&local_59);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_58);
      local_6d = 0;
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    puVar1 = *(ushort **)end_local;
    *(ushort **)end_local = puVar1 + 1;
    local_36 = *puVar1;
    if ((long)puStack_30 - *(long *)end_local >> 1 < (long)(int)(local_36 + 1)) break;
    *faces_local = (uint)local_36 + *faces_local;
    *(int *)cursor_local = *(int *)cursor_local + 1;
    *(long *)end_local = *(long *)end_local + (long)(int)(uint)local_36 * 2;
    psVar2 = *(short **)end_local;
    *(short **)end_local = psVar2 + 1;
    if (*psVar2 < 0) {
      puVar1 = *(ushort **)end_local;
      *(ushort **)end_local = puVar1 + 1;
      local_36 = *puVar1;
      CountVertsAndFacesLWOB
                (this,faces_local,(uint *)cursor_local,(uint16_t **)end_local,puStack_30,
                 (uint)local_36);
    }
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"LWOB: Unexpected end of file",&local_91);
  DeadlyImportError::DeadlyImportError(pDVar4,(string *)local_90);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::CountVertsAndFacesLWOB(unsigned int& verts, unsigned int& faces,
    LE_NCONST uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        // must have 2 shorts left for numIndices and surface
        if (end - cursor < 2) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        ::memcpy(&numIndices, cursor++, 2);
        // must have enough left for indices and surface
        if (end - cursor < (1 + numIndices)) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        verts += numIndices;
        faces++;
        cursor += numIndices;
        int16_t surface;
        ::memcpy(&surface, cursor++, 2);
        if (surface < 0)
        {
            // there are detail polygons
            ::memcpy(&numIndices, cursor++, 2);
            CountVertsAndFacesLWOB(verts,faces,cursor,end,numIndices);
        }
    }
}